

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O1

void lts2::ImageWaveletScale(Mat *src,Mat *dest,double *P,double *Q,int fsize,int scale,int *rscale)

{
  undefined4 uVar1;
  float fVar2;
  long lVar3;
  double *pdVar4;
  _InputArray *p_Var5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint n;
  uint uVar14;
  double *pdVar15;
  ulong uVar16;
  uint n_00;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  vector<cv::Mat,_std::allocator<cv::Mat>_> dest_components;
  Mat ret;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_428;
  int local_404;
  Mat *local_400;
  double *local_3f8;
  uint local_3ec;
  double *local_3e8;
  double *local_3e0;
  double *local_3d8;
  ulong local_3d0;
  undefined4 local_3c4;
  undefined4 local_3c0;
  float local_3bc;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_3b8;
  undefined4 local_3a0;
  undefined4 local_39c;
  Mat *local_398;
  Mat *local_390;
  Mat *local_388;
  double local_380;
  double local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_350 [16];
  Size local_340;
  Mat local_2e0 [96];
  Mat aMStack_280 [144];
  Mat local_1f0 [96];
  undefined1 local_190 [16];
  Size SStack_180;
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  local_404 = scale;
  local_3f8 = Q;
  local_3e8 = P;
  cv::Mat::Mat(local_1f0);
  local_3c0 = **(undefined4 **)(src + 0x40);
  local_3c4 = (*(undefined4 **)(src + 0x40))[1];
  local_190._8_8_ = &local_428;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = 0x1010000;
  SStack_180.width = 0;
  SStack_180.height = 0;
  local_190._0_4_ = 0x2050000;
  local_350._8_8_ = src;
  cv::split((_InputArray *)local_350,(_OutputArray *)local_190);
  lVar3 = (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  uVar19 = -(ulong)((ulong)(lVar3 * -0x5555555555555555) >> 0x3d != 0) | lVar3 * 0x5555555555555558;
  local_3d8 = (double *)operator_new__(uVar19);
  local_400 = src;
  local_398 = dest;
  pdVar4 = (double *)operator_new__(uVar19);
  local_3e0 = pdVar4;
  if (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar19 = 0;
    pdVar15 = local_3d8;
    do {
      local_350._8_8_ =
           local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + lVar3;
      local_340.width = 0;
      local_340.height = 0;
      local_350._0_4_ = 0x1010000;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc((_InputArray *)local_350,pdVar15,pdVar4,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      uVar19 = uVar19 + 1;
      uVar9 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      lVar3 = lVar3 + 0x60;
      pdVar4 = pdVar4 + 1;
      pdVar15 = pdVar15 + 1;
    } while (uVar19 <= uVar9 && uVar9 - uVar19 != 0);
  }
  uVar18 = *(uint *)(local_400 + 8);
  n_00 = *(uint *)(local_400 + 0xc);
  local_3d0 = 0;
  if ((uVar18 & 1) == 0 &&
      (((n_00 & 1) == 0 && 0 < local_404) && (fsize <= (int)uVar18 && fsize <= (int)n_00))) {
    uVar9 = 1;
    n = uVar18;
    do {
      local_3d0 = uVar9;
      if (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar19 = 0;
        do {
          local_400 = (Mat *)(uVar19 * 3);
          if (0 < (int)n) {
            uVar18 = 0;
            uVar9 = uVar19 * 0x60;
            do {
              uVar11 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar11 < uVar19 || uVar11 - uVar19 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar19);
                goto LAB_00111e0f;
              }
              Wavegeneral_h(local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar9,uVar18,n_00,0,local_3e8,
                            local_3f8,fsize);
              uVar18 = uVar18 + 1;
            } while (n != uVar18);
          }
          uVar9 = 0xaaaaaaaaaaaaaaab;
          if (0 < (int)n_00) {
            uVar18 = 0;
            do {
              uVar11 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
              if (uVar11 < uVar19 || uVar11 - uVar19 == 0) goto LAB_00111e0f;
              Wavegeneral_v(local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)local_400 * 0x20,uVar18,n,0,
                            local_3e8,local_3f8,fsize);
              uVar18 = uVar18 + 1;
            } while (n_00 != uVar18);
          }
          uVar19 = uVar19 + 1;
          uVar9 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        } while (uVar19 <= uVar9 && uVar9 - uVar19 != 0);
      }
      uVar17 = (int)n_00 >> 1;
      uVar19 = (ulong)uVar17;
      uVar18 = (int)n >> 1;
    } while (((((int)local_3d0 < local_404) && (fsize <= (int)uVar17)) && (fsize <= (int)uVar18)) &&
            (((n_00 & 2) == 0 &&
             (uVar9 = (ulong)((int)local_3d0 + 1), uVar14 = n & 2, n = uVar18, n_00 = uVar17,
             uVar14 == 0))));
  }
  else {
    uVar19 = (ulong)n_00;
  }
  local_3ec = uVar18;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            (&local_3b8,
             ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  lVar3 = (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  uVar9 = -(ulong)((ulong)(lVar3 * -0x5555555555555555) >> 0x3e != 0) | lVar3 * -0x5555555555555554;
  pvVar6 = operator_new__(uVar9);
  pvVar7 = operator_new__(uVar9);
  if (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_390 = aMStack_280;
    local_388 = aMStack_c0;
    uVar11 = (ulong)local_3ec;
    uVar9 = 0;
    do {
      pdVar4 = (double *)(uVar9 * 0x60);
      uVar1 = **(undefined4 **)
                (local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x10 + (long)pdVar4);
      *(undefined4 *)((long)pvVar7 + uVar9 * 4) = uVar1;
      *(undefined4 *)((long)pvVar6 + uVar9 * 4) = uVar1;
      uVar12 = ((long)local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      if (uVar12 < uVar9 || uVar12 - uVar9 == 0) goto LAB_00111e42;
      local_3a0 = local_3c4;
      local_39c = local_3c0;
      local_3f8 = pdVar4;
      cv::Mat::create(local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)pdVar4,&local_3a0,5);
      if (0 < (int)local_3ec) {
        uVar13 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        uVar12 = 0;
        do {
          if (0 < (int)uVar19) {
            if (uVar13 < uVar9 || uVar13 - uVar9 == 0) goto LAB_00111e20;
            lVar3 = **(long **)(local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start + (long)local_3f8 + 0x48) *
                    uVar12 + *(long *)(local_428.
                                       super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                                       .super__Vector_impl_data._M_start + (long)local_3f8 + 0x10);
            fVar20 = *(float *)((long)pvVar6 + uVar9 * 4);
            fVar21 = *(float *)((long)pvVar7 + uVar9 * 4);
            uVar16 = 0;
            do {
              fVar2 = *(float *)(lVar3 + uVar16 * 4);
              if (fVar2 <= fVar20) {
                fVar20 = fVar2;
              }
              *(float *)((long)pvVar6 + uVar9 * 4) = fVar20;
              fVar2 = *(float *)(lVar3 + uVar16 * 4);
              if (fVar21 <= fVar2) {
                fVar21 = fVar2;
              }
              *(float *)((long)pvVar7 + uVar9 * 4) = fVar21;
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar11);
      }
      uVar12 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      if (uVar12 < uVar9 || uVar12 - uVar9 == 0) goto LAB_00111e31;
      local_400 = (Mat *)local_3d8[uVar9];
      local_3e8 = (double *)(local_3e0[uVar9] - (double)local_400);
      local_3bc = *(float *)((long)pvVar6 + uVar9 * 4);
      local_380 = (double)(*(float *)((long)pvVar7 + uVar9 * 4) - local_3bc);
      cv::operator*((double)(float)((double)local_3e8 / local_380),(Mat *)local_190);
      local_378 = (double)(float)((double)local_400 -
                                 ((double)local_3e8 * (double)local_3bc) / local_380);
      uStack_370 = 0;
      local_368 = 0;
      uStack_360 = 0;
      cv::operator+((MatExpr *)local_350,(Scalar_ *)local_190);
      uVar12 = ((long)local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      if (uVar12 < uVar9 || uVar12 - uVar9 == 0) goto LAB_00111e53;
      (**(code **)(*(long *)CONCAT44(local_350._4_4_,local_350._0_4_) + 0x18))
                ((long *)CONCAT44(local_350._4_4_,local_350._0_4_),local_350,
                 local_3b8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)local_3f8,0xffffffff);
      cv::Mat::~Mat(local_390);
      cv::Mat::~Mat(local_2e0);
      cv::Mat::~Mat((Mat *)(local_350 + 0x10));
      cv::Mat::~Mat(local_388);
      cv::Mat::~Mat(local_120);
      cv::Mat::~Mat((Mat *)(local_190 + 0x10));
      uVar9 = uVar9 + 1;
      uVar12 = ((long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_428.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    } while (uVar9 <= uVar12 && uVar12 - uVar9 != 0);
  }
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = 0x1050000;
  local_350._8_8_ = &local_3b8;
  SStack_180.width = 0;
  SStack_180.height = 0;
  local_190._0_4_ = 0x2010000;
  local_190._8_8_ = local_398;
  cv::merge((_InputArray *)local_350,(_OutputArray *)local_190);
  iVar10 = (int)local_3d0;
  if (local_404 == 0) {
    iVar10 = 0;
  }
  *rscale = iVar10;
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  operator_delete__(local_3d8);
  operator_delete__(local_3e0);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3b8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_428);
  cv::Mat::~Mat(local_1f0);
  return;
LAB_00111e0f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19);
LAB_00111e20:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_00111e31:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_00111e42:
  uVar12 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar9);
LAB_00111e53:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9,uVar12);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_3b8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_428);
  cv::Mat::~Mat(local_1f0);
  _Unwind_Resume(uVar8);
}

Assistant:

void lts2::ImageWaveletScale(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int scale, int *rscale)
{
  cv::Mat ret;
  float *min, *max, a, c;
	
  cv::Size imageSize = src.size();
        
  std::vector<cv::Mat> components, dest_components;
  cv::split(src, components);
    
  double *omin = new double[components.size()];
  double *omax = new double[components.size()];
    
  for (int b = 0; b < components.size(); ++b)
    cv::minMaxLoc(components.at(b), &omin[b], &omax[b]);
	
  int width = src.cols;
  int height = src.rows;
  int num = 1;
	
  while(num<=scale && width>=fsize && height>=fsize && !(width%2) && !(height%2)) 
  {
    for (int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
    width /= 2; 
    height /= 2;
    ++num;
  }
    
  dest_components.reserve(components.size());
    	
  min = new float[components.size()];
  max = new float[components.size()];
    
  for (int b = 0; b < components.size(); ++b) 
  {
    min[b] = max[b] = components.at(b).at<float>(0, 0);
    dest_components.at(b).create(imageSize, CV_32FC1);
        
    for(int j = 0; j < height; ++j) 
    {
      for(int i = 0; i < width; ++i) 
      {
        min[b] = MIN(components.at(b).at<float>(j, i), min[b]);
        max[b] = MAX(components.at(b).at<float>(j, i), max[b]);
      }
    }
    a = (omax[b] - omin[b]) / (max[b] - min[b]);
    c = omin[b] - min[b]*(omax[b] - omin[b]) / (max[b] - min[b]);
        
    dest_components.at(b) = a * components.at(b) + c;
  }
    
  cv::merge(dest_components, dest);
    
  if (scale != 0) 
    *rscale = num - 1;
  else 
    *rscale = 0;
    
  delete[] min;
  delete[] max;
  delete[] omin;
  delete[] omax;
	
  return;
}